

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::
ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
::set_host_name(ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                *this,string *name)

{
  error_code ec_00;
  error_code ec;
  error_code local_58;
  system_error local_48;
  
  local_58.val_ = 0;
  local_58._4_4_ = local_58._4_4_ & 0xffffff00;
  local_58.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  set_host_name(this,name,&local_58);
  if (local_58.failed_ != true) {
    return;
  }
  ec_00.failed_ = local_58.failed_;
  ec_00._5_3_ = local_58._5_3_;
  ec_00.val_ = local_58.val_;
  ec_00.cat_ = local_58.cat_;
  boost::system::system_error::system_error(&local_48,ec_00);
  boost::throw_exception<boost::system::system_error>(&local_48);
}

Assistant:

void set_host_name(std::string const& name)
	{
		error_code ec;
		set_host_name(name, ec);
		if (ec) boost::throw_exception(boost::system::system_error(ec));
	}